

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O2

void addJsonValue(QJsonValue *value,QString *keyPrefix,ProValueMap *map)

{
  double dVar1;
  char cVar2;
  undefined4 uVar3;
  qsizetype qVar4;
  char *data;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QJsonObject local_70 [8];
  QArrayDataPointer<QString> local_68;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = QJsonValue::type();
  switch(uVar3) {
  case 1:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    cVar2 = QJsonValue::toBool(SUB81(value,0));
    data = "false";
    if (cVar2 != '\0') {
      data = "true";
    }
    qVar4 = QtPrivate::lengthHelperPointer<char>(data);
    latin1.m_data = data;
    latin1.m_size = qVar4;
    QString::QString((QString *)local_48,latin1);
    goto LAB_001eda21;
  case 2:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    dVar1 = (double)QJsonValue::toDouble(0.0);
    QString::number(dVar1,(char)(QString *)local_48,0x67);
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_68,(QString *)local_48);
    insertJsonKeyValue(keyPrefix,(QStringList *)&local_68,map);
    goto LAB_001edad8;
  case 3:
    local_68.d = (Data *)0x0;
    local_68.ptr = (QString *)0x0;
    local_68.size = 0;
    QJsonValue::toString();
LAB_001eda21:
    QList<QString>::emplaceBack<QString>((QList<QString> *)&local_68,(QString *)local_48);
    insertJsonKeyValue(keyPrefix,(QStringList *)&local_68,map);
LAB_001edad8:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
    break;
  case 4:
    QJsonValue::toArray();
    local_48[8] = '.';
    local_48._0_8_ = keyPrefix;
    QStringBuilder<const_QString_&,_QLatin1Char>::convertTo<QString>
              ((QString *)&local_68,(QStringBuilder<const_QString_&,_QLatin1Char> *)local_48);
    addJsonArray((QJsonArray *)local_70,(QString *)&local_68,map);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QJsonArray::~QJsonArray((QJsonArray *)local_70);
    break;
  case 5:
    QJsonValue::toObject();
    local_48[8] = '.';
    local_48._0_8_ = keyPrefix;
    QStringBuilder<const_QString_&,_QLatin1Char>::convertTo<QString>
              ((QString *)&local_68,(QStringBuilder<const_QString_&,_QLatin1Char> *)local_48);
    addJsonObject(local_70,(QString *)&local_68,map);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    QJsonObject::~QJsonObject(local_70);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void addJsonValue(const QJsonValue &value, const QString &keyPrefix, ProValueMap *map)
{
    switch (value.type()) {
    case QJsonValue::Bool:
        insertJsonKeyValue(keyPrefix, QStringList() << (value.toBool() ? QLatin1String("true") : QLatin1String("false")), map);
        break;
    case QJsonValue::Double:
        insertJsonKeyValue(keyPrefix, QStringList() << QString::number(value.toDouble()), map);
        break;
    case QJsonValue::String:
        insertJsonKeyValue(keyPrefix, QStringList() << value.toString(), map);
        break;
    case QJsonValue::Array:
        addJsonArray(value.toArray(), keyPrefix + QLatin1Char('.'), map);
        break;
    case QJsonValue::Object:
        addJsonObject(value.toObject(), keyPrefix + QLatin1Char('.'), map);
        break;
    default:
        break;
    }
}